

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

st__table * st__copy(st__table *old_table)

{
  int iVar1;
  st__table_entry **ppsVar2;
  st__compare_func_type p_Var3;
  st__hash_func_type p_Var4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  st__table *__ptr;
  st__table_entry **__ptr_00;
  st__table_entry *psVar9;
  uint uVar10;
  st__table_entry *psVar11;
  ulong uVar12;
  long lVar13;
  st__table_entry *psVar14;
  
  iVar1 = old_table->num_bins;
  __ptr = (st__table *)malloc(0x30);
  if (__ptr != (st__table *)0x0) {
    __ptr->grow_factor = old_table->grow_factor;
    p_Var3 = old_table->compare;
    p_Var4 = old_table->hash;
    iVar6 = old_table->num_entries;
    iVar7 = old_table->max_density;
    iVar8 = old_table->reorder_flag;
    __ptr->num_bins = old_table->num_bins;
    __ptr->num_entries = iVar6;
    __ptr->max_density = iVar7;
    __ptr->reorder_flag = iVar8;
    __ptr->compare = p_Var3;
    __ptr->hash = p_Var4;
    __ptr_00 = (st__table_entry **)malloc((long)iVar1 * 8);
    __ptr->bins = __ptr_00;
    if (__ptr_00 != (st__table_entry **)0x0) {
      if (iVar1 < 1) {
        return __ptr;
      }
      ppsVar2 = old_table->bins;
      uVar10 = 1;
      lVar13 = 0;
      while( true ) {
        __ptr_00[lVar13] = (st__table_entry *)0x0;
        psVar14 = ppsVar2[lVar13];
        if (psVar14 != (st__table_entry *)0x0) break;
LAB_00499b5d:
        lVar13 = lVar13 + 1;
        uVar10 = uVar10 + 1;
        if (lVar13 == iVar1) {
          return __ptr;
        }
      }
      psVar11 = (st__table_entry *)0x0;
LAB_00499b33:
      psVar9 = (st__table_entry *)malloc(0x18);
      if (psVar9 != (st__table_entry *)0x0) goto code_r0x00499b42;
      uVar12 = 0;
      do {
        psVar14 = __ptr_00[uVar12];
        while (psVar14 != (st__table_entry *)0x0) {
          psVar11 = psVar14->next;
          free(psVar14);
          psVar14 = psVar11;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar10);
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (st__table *)0x0;
code_r0x00499b42:
  pcVar5 = psVar14->record;
  psVar9->key = psVar14->key;
  psVar9->record = pcVar5;
  psVar9->next = psVar11;
  __ptr_00[lVar13] = psVar9;
  psVar14 = psVar14->next;
  psVar11 = psVar9;
  if (psVar14 == (st__table_entry *)0x0) goto LAB_00499b5d;
  goto LAB_00499b33;
}

Assistant:

st__table *
 st__copy( st__table *old_table)
{
    st__table *newEntry_table;
    st__table_entry *ptr, *newEntryptr, *next, *newEntry;
    int i, j, num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC( st__table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }
    
    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC( st__table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }
    for(i = 0; i < num_bins ; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
        newEntry = ABC_ALLOC( st__table_entry, 1);
        if (newEntry == NULL) {
        for (j = 0; j <= i; j++) {
            newEntryptr = newEntry_table->bins[j];
            while (newEntryptr != NULL) {
            next = newEntryptr->next;
            ABC_FREE(newEntryptr);
            newEntryptr = next;
            }
        }
        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}